

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O0

void uECC_vli_mult(uECC_word_t *result,uECC_word_t *left,uECC_word_t *right,wordcount_t num_words)

{
  char local_42;
  char local_41;
  wordcount_t k;
  uECC_word_t uStack_40;
  wordcount_t i;
  uECC_word_t r2;
  uECC_word_t r1;
  uECC_word_t r0;
  uECC_word_t *puStack_20;
  wordcount_t num_words_local;
  uECC_word_t *right_local;
  uECC_word_t *left_local;
  uECC_word_t *result_local;
  
  r1 = 0;
  r2 = 0;
  r0._7_1_ = num_words;
  puStack_20 = right;
  right_local = left;
  left_local = result;
  for (local_42 = '\0'; uStack_40 = 0, local_42 < r0._7_1_; local_42 = local_42 + '\x01') {
    for (local_41 = '\0'; local_41 <= local_42; local_41 = local_41 + '\x01') {
      muladd(right_local[local_41],puStack_20[(int)local_42 - (int)local_41],&r1,&r2,
             &stack0xffffffffffffffc0);
    }
    left_local[local_42] = r1;
    r1 = r2;
    r2 = uStack_40;
  }
  for (local_42 = r0._7_1_; uStack_40 = 0, (int)local_42 < r0._7_1_ * 2 + -1;
      local_42 = local_42 + '\x01') {
    for (local_41 = (local_42 + '\x01') - r0._7_1_; local_41 < r0._7_1_;
        local_41 = local_41 + '\x01') {
      muladd(right_local[local_41],puStack_20[(int)local_42 - (int)local_41],&r1,&r2,
             &stack0xffffffffffffffc0);
    }
    left_local[local_42] = r1;
    r1 = r2;
    r2 = uStack_40;
  }
  left_local[r0._7_1_ * 2 + -1] = r1;
  return;
}

Assistant:

uECC_VLI_API void uECC_vli_mult(uECC_word_t *result,
                                const uECC_word_t *left,
                                const uECC_word_t *right,
                                wordcount_t num_words) {
    uECC_word_t r0 = 0;
    uECC_word_t r1 = 0;
    uECC_word_t r2 = 0;
    wordcount_t i, k;

    /* Compute each digit of result in sequence, maintaining the carries. */
    for (k = 0; k < num_words; ++k) {
        for (i = 0; i <= k; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    for (k = num_words; k < num_words * 2 - 1; ++k) {
        for (i = (k + 1) - num_words; i < num_words; ++i) {
            muladd(left[i], right[k - i], &r0, &r1, &r2);
        }
        result[k] = r0;
        r0 = r1;
        r1 = r2;
        r2 = 0;
    }
    result[num_words * 2 - 1] = r0;
}